

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

void __thiscall DataRefs::SetChannelEnabled(DataRefs *this,dataRefsLT ch,bool bEnable)

{
  bool bVar1;
  int iVar2;
  logLevelTy lVar3;
  byte in_DL;
  int in_ESI;
  DataRefs *in_RDI;
  
  in_RDI->bChannel[in_ESI + -0x62] = (uint)(in_DL & 1);
  bVar1 = IsChannelEnabled(in_RDI,DR_CHANNEL_OPEN_SKY_ONLINE);
  if (bVar1) {
    in_RDI->bChannel[8] = 1;
    in_RDI->bChannel[9] = 1;
  }
  if ((((in_DL & 1) == 0) && (iVar2 = AreAircraftDisplayed(in_RDI), iVar2 != 0)) &&
     (bVar1 = LTFlightDataAnyTrackingChEnabled(), !bVar1)) {
    lVar3 = GetLogLevel(&dataRefs);
    if ((int)lVar3 < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x9b6,"SetChannelEnabled",logERR,anon_var_dwarf_69a1b + 4);
    }
    CreateMsgWindow(12.0,logERR,anon_var_dwarf_69a1b + 4);
  }
  return;
}

Assistant:

void DataRefs::SetChannelEnabled (dataRefsLT ch, bool bEnable)
{
    bChannel[ch - DR_CHANNEL_FIRST] = bEnable;
    
    // If OpenSky Tracking is enabled then make sure OpenSky Master is also
    if (IsChannelEnabled(DR_CHANNEL_OPEN_SKY_ONLINE)) {
        bChannel[DR_CHANNEL_OPEN_SKY_AC_MASTERDATA - DR_CHANNEL_FIRST] = true;
        bChannel[DR_CHANNEL_OPEN_SKY_AC_MASTERFILE - DR_CHANNEL_FIRST] = true;
    }
    
    // if a channel got disabled check if any tracking data channel is left
    if (!bEnable && AreAircraftDisplayed() &&   // something just got disabled? And A/C are currently displayed?
        !LTFlightDataAnyTrackingChEnabled())    // but no tracking data channel left active?
    {
        SHOW_MSG(logERR, ERR_CH_NONE_ACTIVE);
    }
}